

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::genAddressReg
          (AssemblyGeneratorX86 *this,Instruction *instr,char *reg)

{
  ostream *poVar1;
  int iVar2;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tlea ");
  poVar1 = std::operator<<(poVar1,reg);
  poVar1 = std::operator<<(poVar1,", [");
  poVar1 = std::operator<<(poVar1,*(char **)(regR32 + (ulong)instr->src * 8));
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 0x800;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,instr->imm32);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffff7ff;
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tand ");
  poVar1 = std::operator<<(poVar1,reg);
  poVar1 = std::operator<<(poVar1,", ");
  iVar2 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    iVar2 = 0x3fff8;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressReg(Instruction& instr, const char* reg = "eax") {
		asmCode << "\tlea " << reg << ", [" << regR32[instr.src] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		asmCode << "\tand " << reg << ", " << ((instr.getModMem()) ? ScratchpadL1Mask : ScratchpadL2Mask) << std::endl;
	}